

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall putto_reader::~putto_reader(putto_reader *this)

{
  putto_reader *this_local;
  
  (this->super_action)._vptr_action = (_func_int **)&PTR__putto_reader_0019aec8;
  std::__cxx11::string::~string((string *)&this->_loadname);
  std::__cxx11::string::~string((string *)&this->_readername);
  action::~action(&this->super_action);
  return;
}

Assistant:

virtual ~putto_reader() { }